

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

bool __thiscall AmpIO::GetEncoderOverflow(AmpIO *this,uint index)

{
  bool bVar1;
  uint32_t uVar2;
  ostream *poVar3;
  
  uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar2 == 0x64524131) {
    bVar1 = false;
  }
  else if (index < this->NumEncoders) {
    bVar1 = (bool)(*(byte *)((long)this->ReadBuffer + (ulong)(index + this->ENC_POS_OFFSET) * 4 + 3)
                  & 1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"AmpIO::GetEncoderOverflow: index out of range ",0x2e);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", nb channels is ",0x11);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool AmpIO::GetEncoderOverflow(unsigned int index) const
{
    if (GetHardwareVersion() == dRA1_String)
        return false;

    if (index < NumEncoders) {
        return ReadBuffer[index+ENC_POS_OFFSET] & ENC_OVER_MASK;
    } else {
        std::cerr << "AmpIO::GetEncoderOverflow: index out of range " << index
                  << ", nb channels is " << NumEncoders << std::endl;
    }
    return true; // send error "code"
}